

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O0

void __thiscall Code_generator::visit(Code_generator *this,Inst_shift *s)

{
  Register *pRVar1;
  Expression *pEVar2;
  uint uVar3;
  short local_104;
  allocator local_c1;
  string local_c0;
  string local_a0;
  allocator local_79;
  string local_78;
  uint16_t local_52;
  Value_type local_50;
  uint16_t constant;
  Value_type position_type;
  allocator local_39;
  string local_38;
  Inst_shift *local_18;
  Inst_shift *s_local;
  Code_generator *this_local;
  
  local_18 = s;
  s_local = (Inst_shift *)this;
  ast::Instruction::check_alignment(&s->super_Instruction);
  if (7 < local_18->rn->n) {
    pRVar1 = local_18->rn;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Invalid register",&local_39);
    error_report(&pRVar1->location,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  uVar3 = (*local_18->constant->_vptr_Expression[3])();
  if ((uVar3 & 1) != 0) {
    local_50 = ast::Expression::get_type(local_18->constant);
    if (local_50 == ABSOLUTE) {
      local_52 = ast::Expression::get_value(local_18->constant);
      if ((int)(uint)local_52 < 0) {
        pEVar2 = local_18->constant;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_78,"Expression\'s value must be a positive number",&local_79);
        error_report(&pEVar2->location,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
      }
      else if ((local_52 & 0xfff0) != 0) {
        pEVar2 = local_18->constant;
        uVar3 = local_52 & 0xf;
        string_printf_abi_cxx11_
                  (&local_a0,
                   "Expression\'s value = %d (0x%x) not encodable in %d bit, truncate to %d (0x%x)",
                   (ulong)(uint)local_52,(ulong)local_52,4,(ulong)uVar3,uVar3);
        warning_report(&pEVar2->location,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      if (local_18->operation == 0x142) {
        local_104 = -0x2000;
      }
      else if (local_18->operation == 0x143) {
        local_104 = -0x1800;
      }
      else if (local_18->operation == 0x144) {
        local_104 = -0x1000;
      }
      else {
        local_104 = 0;
        if (local_18->operation == 0x145) {
          local_104 = -0x800;
        }
      }
      ast::Sections::write16
                ((local_18->super_Instruction).super_Statement.section_index,
                 (local_18->super_Instruction).super_Statement.section_offset,
                 local_104 + (local_52 & 0xf) * 0x80 + (short)(local_18->rn->n << 4) +
                 (short)local_18->rd->n);
    }
    else if (local_50 == LABEL) {
      pEVar2 = local_18->constant;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c0,"Can\'t be a label, must be a constant",&local_c1);
      error_report(&pEVar2->location,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
  }
  return;
}

Assistant:

void Code_generator::visit(Inst_shift *s)
{
	s->check_alignment();
	if (s->rn->n > 7)
		error_report(&s->rn->location, "Invalid register");

	if (s->constant->evaluate()) {
		auto position_type = s->constant->get_type();
		if (position_type == ABSOLUTE) {
			auto constant = s->constant->get_value();
			if (constant < 0) {
				error_report(&s->constant->location,"Expression's value must be a positive number");
			}
			else if ((constant & ~MAKE_MASK(SHIFT_CONST_SIZE, 0)) != 0) {
				warning_report(&s->constant->location,
					string_printf("Expression's value = %d (0x%x) not encodable in %d bit, truncate to %d (0x%x)",
							constant, constant, SHIFT_CONST_SIZE,
							constant & MAKE_MASK(SHIFT_CONST_SIZE, 0),
							constant & MAKE_MASK(SHIFT_CONST_SIZE, 0)));
			}
			Sections::write16(s->section_index, s->section_offset,
				static_cast<uint16_t>(((
					s->operation == LSL ? LSL_OPCODE
				  		: s->operation == LSR ? LSR_OPCODE
							: s->operation == ASR ? ASR_OPCODE
								: s->operation == ROR ? ROR_OPCODE : 0))
					+ ((constant & MAKE_MASK(SHIFT_CONST_SIZE, 0)) << SHIFT_CONST_POSITION)
					+ (s->rn->n << RN_POSITION) + (s->rd->n << RD_POSITION)));
		}
		else if (position_type == Value_type::LABEL)
			error_report(&s->constant->location,"Can't be a label, must be a constant");
	}
}